

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDElementNSImpl.hpp
# Opt level: O0

void __thiscall xercesc_4_0::XSDElementNSImpl::~XSDElementNSImpl(XSDElementNSImpl *this)

{
  ~XSDElementNSImpl((XSDElementNSImpl *)&this[-1].super_DOMElementNSImpl.fSchemaType);
  return;
}

Assistant:

class CDOM_EXPORT XSDElementNSImpl: public DOMElementNSImpl {
protected:
    XMLFileLoc fLineNo;     //Line number
    XMLFileLoc fColumnNo;   //Column number


public:
    XSDElementNSImpl(DOMDocument *ownerDoc, const XMLCh *name);
    XSDElementNSImpl(DOMDocument *ownerDoc, //DOM Level 2
	                 const XMLCh *namespaceURI,
                     const XMLCh *qualifiedName,
                     const XMLFileLoc lineNo,
                     const XMLFileLoc columnNo);
    XSDElementNSImpl(const XSDElementNSImpl &other, bool deep=false);

    virtual DOMNode * cloneNode(bool deep) const;

    XMLFileLoc getLineNo() const   { return fLineNo;   }
    XMLFileLoc getColumnNo() const { return fColumnNo; }

private:
    // -----------------------------------------------------------------------
    //  Unimplemented constructors and operators
    // -----------------------------------------------------------------------
    XSDElementNSImpl& operator=(const XSDElementNSImpl&);
}